

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ld(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 val;
  TCGv_i64 EA;
  uint uVar2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  if (((uVar1 & 1) != 0) &&
     ((uVar2 = uVar1 >> 0x10 & 0x1f, uVar2 == 0 || (uVar2 == (uVar1 >> 0x15 & 0x1f))))) {
    gen_inval_exception(ctx,1);
    return;
  }
  gen_set_access_type(ctx,0x20);
  EA = tcg_temp_new_i64(tcg_ctx);
  gen_addr_imm_index(ctx,EA,3);
  val = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  if ((ctx->opcode & 2) == 0) {
    gen_qemu_ld64_i64(ctx,val,EA);
  }
  else {
    gen_qemu_ld32s(ctx,val,EA);
  }
  if ((ctx->opcode & 1) != 0) {
    tcg_gen_mov_i64_ppc64
              (tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),EA);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_ld(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    if (Rc(ctx->opcode)) {
        if (unlikely(rA(ctx->opcode) == 0 ||
                     rA(ctx->opcode) == rD(ctx->opcode))) {
            gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
            return;
        }
    }
    gen_set_access_type(ctx, ACCESS_INT);
    EA = tcg_temp_new(tcg_ctx);
    gen_addr_imm_index(ctx, EA, 0x03);
    if (ctx->opcode & 0x02) {
        /* lwa (lwau is undefined) */
        gen_qemu_ld32s(ctx, cpu_gpr[rD(ctx->opcode)], EA);
    } else {
        /* ld - ldu */
        gen_qemu_ld64_i64(ctx, cpu_gpr[rD(ctx->opcode)], EA);
    }
    if (Rc(ctx->opcode)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], EA);
    }
    tcg_temp_free(tcg_ctx, EA);
}